

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

void __thiscall String::String(String *this,Type *on)

{
  ulong uVar1;
  allocator local_62;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  
  *(undefined ***)this = &PTR__Container_0010f9a0;
  std::__cxx11::string::string(local_40,"/std/string",&local_61);
  std::__cxx11::string::string(local_60,"/std/string",&local_62);
  uVar1 = (**(code **)(*(long *)this + 0xc0))(this);
  Typelib::Container::Container(&this->super_Container,local_40,local_60,uVar1,on);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  *(undefined ***)this = &PTR__Container_0010f9a0;
  return;
}

Assistant:

String::String(Type const& on)
    : Container("/std/string", "/std/string", getNaturalSize(), on) {
}